

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.cc
# Opt level: O0

void __thiscall
bloaty::dwarf::CU::ReadHeader
          (CU *this,string_view entire_unit,string_view data,Section section,InfoReader *reader)

{
  string_view format;
  byte bVar1;
  uint8_t uVar2;
  uchar uVar3;
  bool bVar4;
  unsigned_long uVar5;
  uint64_t uVar6;
  mapped_type *pmVar7;
  size_t in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  char *in_R8;
  int in_R9D;
  undefined8 *in_stack_00000008;
  AbbrevTable *in_stack_00000030;
  string_view in_stack_00000038;
  string_view abbrev_data;
  uint64_t debug_abbrev_offset;
  string_view *in_stack_fffffffffffffef8;
  string_view *in_stack_ffffffffffffff00;
  string_view *in_stack_ffffffffffffff08;
  int value;
  Arg *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff38;
  InfoReader *in_stack_ffffffffffffff68;
  CU *in_stack_ffffffffffffff70;
  uint8_t in_stack_ffffffffffffff7f;
  CompilationUnitSizes *in_stack_ffffffffffffff80;
  Arg local_50;
  size_t local_20;
  char *local_18;
  
  in_RDI[1] = in_RSI;
  in_RDI[2] = in_RDX;
  *in_RDI = *in_stack_00000008;
  in_RDI[8] = 0;
  local_50.scratch_._20_4_ = in_R9D;
  local_20 = in_RCX;
  local_18 = in_R8;
  CompilationUnitSizes::ReadDWARFVersion
            ((CompilationUnitSizes *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  bVar1 = CompilationUnitSizes::dwarf_version((CompilationUnitSizes *)(in_RDI + 5));
  if (bVar1 < 6) {
    uVar2 = CompilationUnitSizes::dwarf_version((CompilationUnitSizes *)(in_RDI + 5));
    if (uVar2 == '\x05') {
      in_stack_ffffffffffffff10 = (Arg *)&stack0xffffffffffffffe0;
      uVar3 = ReadFixed<unsigned_char,1ul>(in_stack_ffffffffffffff00);
      *(uchar *)(in_RDI + 7) = uVar3;
      in_stack_ffffffffffffff08 = (string_view *)(in_RDI + 5);
      ReadFixed<unsigned_char,1ul>(in_stack_ffffffffffffff00);
      CompilationUnitSizes::SetAddressSize(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
      CompilationUnitSizes::ReadDWARFOffset
                ((CompilationUnitSizes *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      switch(*(undefined1 *)(in_RDI + 7)) {
      case 1:
      case 3:
        break;
      case 2:
        uVar5 = ReadFixed<unsigned_long,8ul>(in_stack_ffffffffffffff00);
        in_RDI[10] = uVar5;
        uVar6 = CompilationUnitSizes::ReadDWARFOffset
                          ((CompilationUnitSizes *)in_stack_ffffffffffffff00,
                           in_stack_fffffffffffffef8);
        in_RDI[0xb] = uVar6;
        break;
      case 4:
      case 5:
      case 6:
        uVar5 = ReadFixed<unsigned_long,8ul>(in_stack_ffffffffffffff00);
        in_RDI[8] = uVar5;
        break;
      default:
        fprintf(_stderr,"warning: Unknown DWARF Unit Type in user defined range\n");
      }
    }
    else {
      CompilationUnitSizes::ReadDWARFOffset
                ((CompilationUnitSizes *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      in_stack_ffffffffffffff00 = (string_view *)(in_RDI + 5);
      ReadFixed<unsigned_char,1ul>(in_stack_ffffffffffffff00);
      CompilationUnitSizes::SetAddressSize(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
      if (local_50.scratch_._20_4_ == 1) {
        uVar5 = ReadFixed<unsigned_long,8ul>(in_stack_ffffffffffffff00);
        in_RDI[10] = uVar5;
        uVar6 = CompilationUnitSizes::ReadDWARFOffset
                          ((CompilationUnitSizes *)in_stack_ffffffffffffff00,
                           in_stack_fffffffffffffef8);
        in_RDI[0xb] = uVar6;
      }
    }
    pmVar7 = std::
             unordered_map<unsigned_long,_bloaty::dwarf::AbbrevTable,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::dwarf::AbbrevTable>_>_>
             ::operator[]((unordered_map<unsigned_long,_bloaty::dwarf::AbbrevTable,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::dwarf::AbbrevTable>_>_>
                           *)in_stack_ffffffffffffff00,&in_stack_fffffffffffffef8->_M_len);
    in_RDI[6] = pmVar7;
    bVar4 = AbbrevTable::IsEmpty((AbbrevTable *)0x21c9d1);
    if (bVar4) {
      SkipBytes((size_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      AbbrevTable::ReadAbbrevs(in_stack_00000030,in_stack_00000038);
    }
    in_RDI[3] = local_20;
    in_RDI[4] = local_18;
    ReadTopLevelDIE(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if ((in_stack_00000008[1] == 0) || (*(long *)(in_stack_00000008[1] + 0x40) != in_RDI[8])) {
      in_RDI[9] = in_RDI;
    }
    else {
      in_RDI[9] = in_stack_00000008[1];
    }
    return;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&in_stack_ffffffffffffff10->piece_,(char *)in_stack_ffffffffffffff08);
  value = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  CompilationUnitSizes::dwarf_version((CompilationUnitSizes *)(in_RDI + 5));
  absl::substitute_internal::Arg::Arg(in_stack_ffffffffffffff10,value);
  format._M_str = in_stack_ffffffffffffff38;
  format._M_len = (size_t)in_RDI;
  absl::Substitute_abi_cxx11_(format,&local_50);
  std::__cxx11::string::c_str();
  Throw((char *)in_stack_ffffffffffffff10,value);
}

Assistant:

void CU::ReadHeader(string_view entire_unit, string_view data,
                    InfoReader::Section section, InfoReader& reader) {
  entire_unit_ = entire_unit;
  dwarf_ = &reader.dwarf_;
  dwo_id_ = 0;
  unit_sizes_.ReadDWARFVersion(&data);

  if (unit_sizes_.dwarf_version() > 5) {
    THROWF("Data is in DWARF $0 format which we don't understand",
           unit_sizes_.dwarf_version());
  }

  uint64_t debug_abbrev_offset;

  if (unit_sizes_.dwarf_version() == 5) {
    unit_type_ = ReadFixed<uint8_t>(&data);
    unit_sizes_.SetAddressSize(ReadFixed<uint8_t>(&data));
    debug_abbrev_offset = unit_sizes_.ReadDWARFOffset(&data);

    switch (unit_type_) {
      case DW_UT_skeleton:
      case DW_UT_split_compile:
      case DW_UT_split_type:
        dwo_id_ = ReadFixed<uint64_t>(&data);
        break;
      case DW_UT_type:
        unit_type_signature_ = ReadFixed<uint64_t>(&data);
        unit_type_offset_ = unit_sizes_.ReadDWARFOffset(&data);
        break;
      case DW_UT_compile:
      case DW_UT_partial:
        break;
      default:
        fprintf(stderr, "warning: Unknown DWARF Unit Type in user defined range\n");
        break;
    }

  } else {
    debug_abbrev_offset = unit_sizes_.ReadDWARFOffset(&data);
    unit_sizes_.SetAddressSize(ReadFixed<uint8_t>(&data));

    if (section == InfoReader::Section::kDebugTypes) {
      unit_type_signature_ = ReadFixed<uint64_t>(&data);
      unit_type_offset_ = unit_sizes_.ReadDWARFOffset(&data);
    }
  }

  unit_abbrev_ = &reader.abbrev_tables_[debug_abbrev_offset];

  // If we haven't already read abbreviations for this debug_abbrev_offset_, we
  // need to do so now.
  if (unit_abbrev_->IsEmpty()) {
    string_view abbrev_data = dwarf_->debug_abbrev;
    SkipBytes(debug_abbrev_offset, &abbrev_data);
    unit_abbrev_->ReadAbbrevs(abbrev_data);
  }

  data_ = data;
  ReadTopLevelDIE(reader);

  if (reader.skeleton_ && reader.skeleton_->dwo_id_ == dwo_id_) {
    skeleton_ = reader.skeleton_;
  } else {
    skeleton_ = this;
  }
}